

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O3

cio_error cio_random_seed_rng(cio_rng_t *rng)

{
  cio_error cVar1;
  long lVar2;
  uint64_t uStack_30;
  uint64_t seeds [2];
  
  lVar2 = 0x5851f42d4c957f2d;
  cVar1 = cio_entropy_get_bytes(seeds,0x10);
  if (cVar1 == CIO_SUCCESS) {
    uStack_30 = seeds[1] * 2 + 1;
    lVar2 = (seeds[0] + uStack_30) * 0x5851f42d4c957f2d + seeds[1] * 2;
  }
  else {
    uStack_30 = 1;
  }
  rng->inc = uStack_30;
  rng->state = lVar2 + 1;
  return cVar1;
}

Assistant:

enum cio_error cio_random_seed_rng(cio_rng_t *rng)
{
	uint64_t seeds[2];
	enum cio_error err = cio_entropy_get_bytes(&seeds, sizeof(seeds));
	if (cio_likely(err == CIO_SUCCESS)) {
		pcg_setseq_64_srandom_r(rng, seeds[0], seeds[1]);
	} else {
		pcg_setseq_64_srandom_r(rng, UINT64_C(0), UINT64_C(0));
	}

	return err;
}